

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O2

exr_result_t DwaCompressor_setupChannelData(DwaCompressor *me)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CompressorScheme CVar5;
  ChannelData *pCVar6;
  exr_coding_channel_info_t *peVar7;
  uint8_t *puVar8;
  int i;
  long lVar9;
  long lVar10;
  size_t c;
  long lVar11;
  size_t sVar12;
  uint8_t *puVar13;
  long alStack_48 [3];
  uint8_t *planarUncBuffer [3];
  
  for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
    alStack_48[lVar9] = (long)me->_planarUncBuffer[lVar9];
  }
  iVar2 = me->_numChannels;
  lVar9 = 0;
  for (lVar11 = 0; lVar11 != iVar2; lVar11 = lVar11 + 1) {
    pCVar6 = me->_channelData;
    peVar7 = pCVar6[lVar11].chan;
    iVar3 = peVar7->width;
    iVar4 = peVar7->height;
    cVar1 = peVar7->bytes_per_element;
    sVar12 = (long)iVar4 * (long)iVar3 * (long)cVar1;
    pCVar6[lVar11].planarUncSize = sVar12;
    CVar5 = pCVar6[lVar11].compression;
    puVar8 = (uint8_t *)alStack_48[CVar5];
    pCVar6[lVar11].planarUncBuffer = puVar8;
    pCVar6[lVar11].planarUncBufferEnd = puVar8;
    pCVar6[lVar11].planarUncRle[0] = puVar8;
    pCVar6[lVar11].planarUncRleEnd[0] = puVar8;
    puVar13 = puVar8;
    for (lVar10 = 0x43; puVar13 = puVar13 + iVar4 * iVar3, lVar10 + -0x42 < (long)cVar1;
        lVar10 = lVar10 + 1) {
      *(uint8_t **)((long)(pCVar6->_dctData)._dctData + lVar10 * 8 + lVar9 + -0x40) = puVar13;
      *(uint8_t **)((long)(pCVar6->_dctData)._dctData + lVar10 * 8 + lVar9 + -0x20) = puVar13;
    }
    pCVar6[lVar11].planarUncType = (uint)peVar7->data_type;
    if (CVar5 == LOSSY_DCT) {
      pCVar6[lVar11].planarUncType = EXR_PIXEL_FLOAT;
    }
    else {
      alStack_48[CVar5] = (long)(puVar8 + sVar12);
    }
    lVar9 = lVar9 + 0x240;
  }
  return iVar2;
}

Assistant:

exr_result_t
DwaCompressor_setupChannelData (DwaCompressor* me)
{
    uint8_t* planarUncBuffer[NUM_COMPRESSOR_SCHEMES];

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        planarUncBuffer[i] = 0;

        if (me->_planarUncBuffer[i])
            planarUncBuffer[i] = me->_planarUncBuffer[i];
    }

    for (size_t c = 0; c < me->_numChannels; ++c)
    {
        ChannelData*                     cd   = me->_channelData + c;
        const exr_coding_channel_info_t* curc = cd->chan;
        size_t                           uncSize;

        uncSize = (size_t) curc->width * (size_t) curc->height *
                  (size_t) curc->bytes_per_element;
        cd->planarUncSize = uncSize;

        cd->planarUncBuffer    = planarUncBuffer[cd->compression];
        cd->planarUncBufferEnd = cd->planarUncBuffer;

        cd->planarUncRle[0]    = cd->planarUncBuffer;
        cd->planarUncRleEnd[0] = cd->planarUncRle[0];

        for (int byte = 1; byte < curc->bytes_per_element; ++byte)
        {
            cd->planarUncRle[byte] =
                cd->planarUncRle[byte - 1] + curc->width * curc->height;

            cd->planarUncRleEnd[byte] = cd->planarUncRle[byte];
        }

        cd->planarUncType = (exr_pixel_type_t) curc->data_type;

        if (cd->compression == LOSSY_DCT)
        {
            cd->planarUncType = EXR_PIXEL_FLOAT;
        }
        else { planarUncBuffer[cd->compression] += uncSize; }
    }

    return EXR_ERR_SUCCESS;
}